

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Sat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *vCexes;
  bool bVar1;
  bool bVar2;
  Abc_Frame_t *pAbc_00;
  int iVar3;
  uint uVar4;
  Vec_Int_t *__ptr;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  Vec_Str_t *vStatus;
  Cec_ParSat_t ParsSat;
  Vec_Int_t *local_68;
  Cec_ParSat_t local_5c;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Cec_ManSatSetDefaultParams(&local_5c);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = false;
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"CSNanmtcxvh"), pAbc_00 = local_38,
          iVar8 = globalUtilOptind, 0x60 < iVar3) {
      switch(iVar3) {
      case 0x6d:
        local_5c.fCheckMiter = local_5c.fCheckMiter ^ 1;
        break;
      case 0x6e:
        local_5c.fNonChrono = local_5c.fNonChrono ^ 1;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x75:
      case 0x77:
        goto switchD_0027e26e_caseD_6f;
      case 0x74:
        local_5c.fLearnCls = local_5c.fLearnCls ^ 1;
        break;
      case 0x76:
        local_5c.fVerbose = local_5c.fVerbose ^ 1;
        break;
      case 0x78:
        bVar2 = (bool)(bVar2 ^ 1);
        break;
      default:
        if (iVar3 == 0x61) {
          local_5c.fSaveCexes = local_5c.fSaveCexes ^ 1;
        }
        else {
          if (iVar3 != 99) goto switchD_0027e26e_caseD_6f;
          bVar1 = (bool)(bVar1 ^ 1);
        }
      }
    }
    if (iVar3 < 0x4e) {
      if (iVar3 != 0x43) {
        if (iVar3 == -1) {
          pGVar5 = local_38->pGia;
          if (pGVar5 != (Gia_Man_t *)0x0) {
            if (bVar1) {
              if (bVar2) {
                __ptr = Cbs2_ManSolveMiterNc
                                  (pGVar5,local_5c.nBTLimit,(Vec_Str_t **)&local_68,
                                   local_5c.fVerbose);
              }
              else if (local_5c.fLearnCls == 0) {
                if (local_5c.fNonChrono == 0) {
                  __ptr = Cbs_ManSolveMiter(pGVar5,local_5c.nBTLimit,(Vec_Str_t **)&local_68,
                                            local_5c.fVerbose);
                }
                else {
                  __ptr = Cbs_ManSolveMiterNc(pGVar5,local_5c.nBTLimit,(Vec_Str_t **)&local_68,
                                              local_5c.fVerbose);
                }
              }
              else {
                __ptr = Tas_ManSolveMiterNc(pGVar5,local_5c.nBTLimit,(Vec_Str_t **)&local_68,
                                            local_5c.fVerbose);
              }
              if (__ptr->pArray != (int *)0x0) {
                free(__ptr->pArray);
                __ptr->pArray = (int *)0x0;
              }
              if (__ptr != (Vec_Int_t *)0x0) {
                free(__ptr);
              }
              if (local_68->pArray != (int *)0x0) {
                free(local_68->pArray);
                local_68->pArray = (int *)0x0;
              }
              if (local_68 != (Vec_Int_t *)0x0) {
                free(local_68);
              }
            }
            else {
              pGVar5 = Cec_ManSatSolving(pGVar5,&local_5c);
              Abc_FrameUpdateGia(pAbc_00,pGVar5);
            }
            vCexes = pAbc_00->pGia->vSeqModelVec;
            if (vCexes == (Vec_Ptr_t *)0x0) {
              return 0;
            }
            local_68 = Abc_FrameDeriveStatusArray2(vCexes);
            Abc_FrameReplacePoStatuses(pAbc_00,&local_68);
            Abc_FrameReplaceCexVec(pAbc_00,&pAbc_00->pGia->vSeqModelVec);
            return 0;
          }
          pcVar6 = "Abc_CommandAbc9Sat(): There is no AIG.\n";
          iVar8 = -1;
          goto LAB_0027e4e6;
        }
        goto switchD_0027e26e_caseD_6f;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0027e371;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_5c.nBTLimit = uVar4;
    }
    else if (iVar3 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0027e371;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_5c.nCallsRecycle = uVar4;
    }
    else {
      if (iVar3 != 0x53) goto switchD_0027e26e_caseD_6f;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
LAB_0027e371:
        Abc_Print(-1,pcVar6);
        goto switchD_0027e26e_caseD_6f;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_5c.nSatVarMax = uVar4;
    }
    globalUtilOptind = iVar8 + 1;
    if ((int)uVar4 < 0) {
switchD_0027e26e_caseD_6f:
      Abc_Print(-2,"usage: &sat [-CSN <num>] [-anmctxvh]\n");
      Abc_Print(-2,"\t         performs SAT solving for the combinational outputs\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)local_5c.nBTLimit);
      Abc_Print(-2,"\t-S num : the min number of variables to recycle the solver [default = %d]\n",
                (ulong)(uint)local_5c.nSatVarMax);
      Abc_Print(-2,"\t-N num : the min number of calls to recycle the solver [default = %d]\n",
                (ulong)(uint)local_5c.nCallsRecycle);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_5c.fSaveCexes == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-a     : toggle solving all outputs and saving counter-examples [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (local_5c.fNonChrono == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle using non-chronological backtracking [default = %s]\n",pcVar6)
      ;
      pcVar6 = "miter";
      if (local_5c.fCheckMiter == 0) {
        pcVar6 = "circuit";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_5c.fLearnCls == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using learning in curcuit-based solver [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle using new solver [default = %s]\n",pcVar6);
      if (local_5c.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar8 = -2;
LAB_0027e4e6:
      Abc_Print(iVar8,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose );
    Cec_ParSat_t ParsSat, * pPars = &ParsSat;
    Gia_Man_t * pTemp;
    int c;
    int fNewSolver = 0, fCSat = 0;
    Cec_ManSatSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CSNanmtcxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCallsRecycle = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCallsRecycle < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fSaveCexes ^= 1;
            break;
        case 'n':
            pPars->fNonChrono ^= 1;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 't':
            pPars->fLearnCls ^= 1;
            break;
        case 'c':
            fCSat ^= 1;
            break;
        case 'x':
            fNewSolver ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sat(): There is no AIG.\n" );
        return 1;
    }
    if ( fCSat )
    {
        Vec_Int_t * vCounters;
        Vec_Str_t * vStatus;
        if ( fNewSolver )
            vCounters = Cbs2_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else if ( pPars->fLearnCls )
            vCounters = Tas_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else if ( pPars->fNonChrono )
            vCounters = Cbs_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else
            vCounters = Cbs_ManSolveMiter( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        Vec_IntFree( vCounters );
        Vec_StrFree( vStatus );
    }
    else
    {
        pTemp = Cec_ManSatSolving( pAbc->pGia, pPars );
        Abc_FrameUpdateGia( pAbc, pTemp );
    }
    if ( pAbc->pGia->vSeqModelVec )
    {
        Vec_Int_t * vStatuses = Abc_FrameDeriveStatusArray2( pAbc->pGia->vSeqModelVec );
        Abc_FrameReplacePoStatuses( pAbc, &vStatuses );
        Abc_FrameReplaceCexVec( pAbc, &pAbc->pGia->vSeqModelVec );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &sat [-CSN <num>] [-anmctxvh]\n" );
    Abc_Print( -2, "\t         performs SAT solving for the combinational outputs\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the min number of variables to recycle the solver [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-N num : the min number of calls to recycle the solver [default = %d]\n", pPars->nCallsRecycle );
    Abc_Print( -2, "\t-a     : toggle solving all outputs and saving counter-examples [default = %s]\n", pPars->fSaveCexes? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle using non-chronological backtracking [default = %s]\n", pPars->fNonChrono? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", fCSat? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using learning in curcuit-based solver [default = %s]\n", pPars->fLearnCls? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle using new solver [default = %s]\n", fNewSolver? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}